

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgvalue.c
# Opt level: O1

int mg_map_insert(mg_map *map,char *key_str,mg_value *value)

{
  uint uVar1;
  uint32_t uVar2;
  int iVar3;
  size_t __n;
  mg_string *pmVar4;
  
  __n = strlen(key_str);
  iVar3 = -0x10;
  if (__n < 0xffffffff) {
    uVar1 = map->size;
    iVar3 = -4;
    if (uVar1 < map->capacity) {
      uVar2 = mg_map_find_key(map,(uint32_t)__n,key_str);
      iVar3 = -7;
      if (uVar2 == uVar1) {
        pmVar4 = (mg_string *)mg_allocator_malloc(&mg_system_allocator,__n + 0x10);
        if (pmVar4 == (mg_string *)0x0) {
          pmVar4 = (mg_string *)0x0;
        }
        else {
          pmVar4->data = (char *)(pmVar4 + 1);
        }
        if (pmVar4 == (mg_string *)0x0) {
          pmVar4 = (mg_string *)0x0;
        }
        else {
          pmVar4->size = (uint32_t)__n;
          memcpy(pmVar4->data,key_str,__n);
        }
        if (pmVar4 == (mg_string *)0x0) {
          iVar3 = -3;
        }
        else {
          uVar1 = map->size;
          map->keys[uVar1] = pmVar4;
          map->values[uVar1] = value;
          map->size = uVar1 + 1;
          iVar3 = 0;
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int mg_map_insert(mg_map *map, const char *key_str, mg_value *value) {
  size_t key_size = strlen(key_str);
  if (key_size >= UINT32_MAX) {
    return MG_ERROR_SIZE_EXCEEDED;
  }
  if (map->size >= map->capacity) {
    return MG_ERROR_CONTAINER_FULL;
  }
  if (mg_map_find_key(map, (uint32_t)key_size, key_str) != map->size) {
    return MG_ERROR_DUPLICATE_KEY;
  }
  mg_string *key = mg_string_make2((uint32_t)key_size, key_str);
  if (!key) {
    return MG_ERROR_OOM;
  }
  mg_map_append(map, key, value);
  return 0;
}